

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

void Mf_ManPrintStats(Mf_Man_t *p,char *pTitle)

{
  abctime aVar1;
  char *pTitle_local;
  Mf_Man_t *p_local;
  
  if (p->pPars->fVerbose != 0) {
    printf("%s :  ",pTitle);
    printf("Level =%6lu   ",p->pPars->Delay);
    printf("Area =%9lu   ",p->pPars->Area);
    printf("Edge =%9lu   ",p->pPars->Edge);
    if (p->pPars->fGenCnf != 0) {
      printf("CNF =%9lu   ",p->pPars->Clause);
    }
    aVar1 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar1 - p->clkStart);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Mf_ManPrintStats( Mf_Man_t * p, char * pTitle )
{
    if ( !p->pPars->fVerbose )
        return;
    printf( "%s :  ", pTitle );
    printf( "Level =%6lu   ",   (long)p->pPars->Delay );
    printf( "Area =%9lu   ",  (long)p->pPars->Area );
    printf( "Edge =%9lu   ",  (long)p->pPars->Edge );
    if ( p->pPars->fGenCnf )
        printf( "CNF =%9lu   ", (long)p->pPars->Clause );
    Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    fflush( stdout );
}